

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

JavascriptArray *
Js::JavascriptOperators::GetOwnPropertyNames(Var instance,ScriptContext *scriptContext)

{
  bool bVar1;
  RecyclableObject *object;
  JavascriptProxy *this;
  JavascriptArray *pJVar2;
  
  object = ToObject(instance,scriptContext);
  bVar1 = VarIs<Js::JavascriptProxy>(instance);
  if (bVar1) {
    this = UnsafeVarTo<Js::JavascriptProxy>(instance);
    if (this != (JavascriptProxy *)0x0) {
      pJVar2 = JavascriptProxy::PropertyKeysTrap(this,GetOwnPropertyNamesKind,scriptContext);
      return pJVar2;
    }
  }
  pJVar2 = JavascriptObject::CreateOwnStringPropertiesHelper(object,scriptContext);
  return pJVar2;
}

Assistant:

JavascriptArray* JavascriptOperators::GetOwnPropertyNames(Var instance, ScriptContext *scriptContext)
    {
        RecyclableObject *object = ToObject(instance, scriptContext);
        AssertOrFailFast(VarIsCorrectType(object)); // Consider moving this check into ToObject
        JavascriptProxy * proxy = JavascriptOperators::TryFromVar<JavascriptProxy>(instance);
        if (proxy)
        {
            return proxy->PropertyKeysTrap(JavascriptProxy::KeysTrapKind::GetOwnPropertyNamesKind, scriptContext);
        }

        return JavascriptObject::CreateOwnStringPropertiesHelper(object, scriptContext);
    }